

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O0

CURLcode concat_url(char *base,char *relurl,char **newurl)

{
  CURLUcode CVar1;
  char *pcVar2;
  size_t len;
  bool bVar3;
  char *sep;
  int level;
  CURLUcode uc;
  CURLcode result;
  char *useurl;
  char *pcStack_58;
  _Bool host_changed;
  char *pathsep;
  char *protsep;
  dynbuf newest;
  char **newurl_local;
  char *relurl_local;
  char *base_local;
  
  useurl._7_1_ = 0;
  *newurl = (char *)0x0;
  newest.toobig = (size_t)newurl;
  pcVar2 = strstr(base,"//");
  pathsep = base;
  if (pcVar2 != (char *)0x0) {
    pathsep = pcVar2 + 2;
  }
  _uc = relurl;
  if (*relurl == '/') {
    if (relurl[1] == '/') {
      *pathsep = '\0';
      _uc = relurl + 2;
      useurl._7_1_ = 1;
    }
    else {
      pcStack_58 = strchr(pathsep,0x2f);
      if (pcStack_58 == (char *)0x0) {
        pcVar2 = strchr(pathsep,0x3f);
        if (pcVar2 != (char *)0x0) {
          *pcVar2 = '\0';
        }
      }
      else {
        pcVar2 = strchr(pathsep,0x3f);
        if ((pcVar2 != (char *)0x0) && (pcVar2 < pcStack_58)) {
          pcStack_58 = pcVar2;
        }
        *pcStack_58 = '\0';
      }
    }
  }
  else {
    sep._4_4_ = 0;
    pcVar2 = strchr(pathsep,0x3f);
    if (pcVar2 != (char *)0x0) {
      *pcVar2 = '\0';
    }
    if ((*relurl != '?') && (pcVar2 = strrchr(pathsep,0x2f), pcVar2 != (char *)0x0)) {
      *pcVar2 = '\0';
    }
    pcVar2 = strchr(pathsep,0x2f);
    if (pcVar2 == (char *)0x0) {
      pathsep = (char *)0x0;
    }
    else {
      pathsep = pcVar2 + 1;
    }
    if ((*relurl == '.') && (relurl[1] == '/')) {
      _uc = relurl + 2;
    }
    while( true ) {
      bVar3 = false;
      if ((*_uc == '.') && (bVar3 = false, _uc[1] == '.')) {
        bVar3 = _uc[2] == '/';
      }
      if (!bVar3) break;
      sep._4_4_ = sep._4_4_ + 1;
      _uc = _uc + 3;
    }
    if (pathsep != (char *)0x0) {
      while (sep._4_4_ != 0) {
        pcVar2 = strrchr(pathsep,0x2f);
        if (pcVar2 == (char *)0x0) {
          *pathsep = '\0';
          break;
        }
        *pcVar2 = '\0';
        sep._4_4_ = sep._4_4_ + -1;
      }
    }
  }
  Curl_dyn_init((dynbuf *)&protsep,8000000);
  base_local._4_4_ = Curl_dyn_add((dynbuf *)&protsep,base);
  if ((base_local._4_4_ == CURLE_OK) &&
     (((*_uc == '/' || (((pathsep != (char *)0x0 && (*pathsep == '\0')) || (*_uc == '?')))) ||
      (base_local._4_4_ = Curl_dyn_addn((dynbuf *)&protsep,"/",1), base_local._4_4_ == CURLE_OK))))
  {
    len = strlen(_uc);
    CVar1 = urlencode_str((dynbuf *)&protsep,_uc,len,(_Bool)((useurl._7_1_ ^ 0xff) & 1),false);
    if (CVar1 == CURLUE_OK) {
      pcVar2 = Curl_dyn_ptr((dynbuf *)&protsep);
      *(char **)newest.toobig = pcVar2;
      base_local._4_4_ = CURLE_OK;
    }
    else {
      base_local._4_4_ = CURLE_OUT_OF_MEMORY;
      if (CVar1 == CURLUE_TOO_LARGE) {
        base_local._4_4_ = CURLE_TOO_LARGE;
      }
    }
  }
  return base_local._4_4_;
}

Assistant:

static CURLcode concat_url(char *base, const char *relurl, char **newurl)
{
  /***
   TRY to append this new path to the old URL
   to the right of the host part. Oh crap, this is doomed to cause
   problems in the future...
  */
  struct dynbuf newest;
  char *protsep;
  char *pathsep;
  bool host_changed = FALSE;
  const char *useurl = relurl;
  CURLcode result = CURLE_OK;
  CURLUcode uc;
  *newurl = NULL;

  /* protsep points to the start of the host name */
  protsep = strstr(base, "//");
  if(!protsep)
    protsep = base;
  else
    protsep += 2; /* pass the slashes */

  if('/' != relurl[0]) {
    int level = 0;

    /* First we need to find out if there's a ?-letter in the URL,
       and cut it and the right-side of that off */
    pathsep = strchr(protsep, '?');
    if(pathsep)
      *pathsep = 0;

    /* we have a relative path to append to the last slash if there's one
       available, or if the new URL is just a query string (starts with a
       '?')  we append the new one at the end of the entire currently worked
       out URL */
    if(useurl[0] != '?') {
      pathsep = strrchr(protsep, '/');
      if(pathsep)
        *pathsep = 0;
    }

    /* Check if there's any slash after the host name, and if so, remember
       that position instead */
    pathsep = strchr(protsep, '/');
    if(pathsep)
      protsep = pathsep + 1;
    else
      protsep = NULL;

    /* now deal with one "./" or any amount of "../" in the newurl
       and act accordingly */

    if((useurl[0] == '.') && (useurl[1] == '/'))
      useurl += 2; /* just skip the "./" */

    while((useurl[0] == '.') &&
          (useurl[1] == '.') &&
          (useurl[2] == '/')) {
      level++;
      useurl += 3; /* pass the "../" */
    }

    if(protsep) {
      while(level--) {
        /* cut off one more level from the right of the original URL */
        pathsep = strrchr(protsep, '/');
        if(pathsep)
          *pathsep = 0;
        else {
          *protsep = 0;
          break;
        }
      }
    }
  }
  else {
    /* We got a new absolute path for this server */

    if(relurl[1] == '/') {
      /* the new URL starts with //, just keep the protocol part from the
         original one */
      *protsep = 0;
      useurl = &relurl[2]; /* we keep the slashes from the original, so we
                              skip the new ones */
      host_changed = TRUE;
    }
    else {
      /* cut off the original URL from the first slash, or deal with URLs
         without slash */
      pathsep = strchr(protsep, '/');
      if(pathsep) {
        /* When people use badly formatted URLs, such as
           "http://www.example.com?dir=/home/daniel" we must not use the first
           slash, if there's a ?-letter before it! */
        char *sep = strchr(protsep, '?');
        if(sep && (sep < pathsep))
          pathsep = sep;
        *pathsep = 0;
      }
      else {
        /* There was no slash. Now, since we might be operating on a badly
           formatted URL, such as "http://www.example.com?id=2380" which
           doesn't use a slash separator as it is supposed to, we need to check
           for a ?-letter as well! */
        pathsep = strchr(protsep, '?');
        if(pathsep)
          *pathsep = 0;
      }
    }
  }

  Curl_dyn_init(&newest, CURL_MAX_INPUT_LENGTH);

  /* copy over the root url part */
  result = Curl_dyn_add(&newest, base);
  if(result)
    return result;

  /* check if we need to append a slash */
  if(('/' == useurl[0]) || (protsep && !*protsep) || ('?' == useurl[0]))
    ;
  else {
    result = Curl_dyn_addn(&newest, "/", 1);
    if(result)
      return result;
  }

  /* then append the new piece on the right side */
  uc = urlencode_str(&newest, useurl, strlen(useurl), !host_changed,
                     FALSE);
  if(uc)
    return (uc == CURLUE_TOO_LARGE) ? CURLE_TOO_LARGE : CURLE_OUT_OF_MEMORY;

  *newurl = Curl_dyn_ptr(&newest);
  return CURLE_OK;
}